

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::rescalePartials
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *scaleFactors,
          float *cumulativeScaleFactors,int fillWithOnes)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  int k;
  long lVar12;
  float fVar13;
  double dVar14;
  undefined1 auVar15 [64];
  
  lVar12 = 0;
  do {
    if (this->kPatternCount <= lVar12) {
      return;
    }
    auVar15 = ZEXT1664(ZEXT816(0) << 0x40);
    iVar6 = (int)lVar12 * this->kPartialsPaddedStateCount;
    iVar5 = this->kPartialsPaddedStateCount * this->kPaddedPatternCount;
    uVar7 = ~(this->kStateCount >> 0x1f) & this->kStateCount;
    uVar8 = ~(this->kCategoryCount >> 0x1f) & this->kCategoryCount;
    iVar10 = iVar6;
    for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      lVar11 = 0;
      while (uVar7 != (uint)lVar11) {
        lVar4 = iVar10 + lVar11;
        lVar11 = lVar11 + 1;
        auVar1 = vmaxss_avx(ZEXT416((uint)destP[lVar4]),auVar15._0_16_);
        auVar15 = ZEXT1664(auVar1);
      }
      iVar10 = iVar10 + iVar5;
    }
    uVar2 = vcmpss_avx512f(auVar15._0_16_,ZEXT416(0),0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar13 = (float)((uint)bVar3 * 0x3f800000 + (uint)!bVar3 * auVar15._0_4_);
    for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      for (lVar11 = 0; uVar7 != (uint)lVar11; lVar11 = lVar11 + 1) {
        destP[iVar6 + lVar11] = (1.0 / fVar13) * destP[iVar6 + lVar11];
      }
      iVar6 = iVar6 + iVar5;
    }
    if ((this->kFlags & 0x400) == 0) {
      scaleFactors[lVar12] = fVar13;
      if (cumulativeScaleFactors != (float *)0x0) {
        dVar14 = log((double)fVar13);
        fVar13 = (float)(dVar14 + (double)cumulativeScaleFactors[lVar12]);
LAB_00146a9a:
        cumulativeScaleFactors[lVar12] = fVar13;
      }
    }
    else {
      dVar14 = log((double)fVar13);
      scaleFactors[lVar12] = (float)dVar14;
      if (cumulativeScaleFactors != (float *)0x0) {
        fVar13 = (float)dVar14 + cumulativeScaleFactors[lVar12];
        goto LAB_00146a9a;
      }
    }
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::rescalePartials(REALTYPE* destP,
        REALTYPE* scaleFactors,
        REALTYPE* cumulativeScaleFactors,
        const int  fillWithOnes) {
    if (DEBUGGING_OUTPUT) {
        std::cerr << "destP (before rescale): \n";// << destP << "\n";
        for(int i=0; i<kPartialsSize; i++)
            fprintf(stderr,"destP[%d] = %.5f\n",i,destP[i]);
    }

    // TODO None of the code below has been optimized.
    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        if (max == 0)
            max = 1.0;

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++)
                destP[offset++] *= oneOverMax;
        }

        if (kFlags & BEAGLE_FLAG_SCALERS_LOG) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
    if (DEBUGGING_OUTPUT) {
        for(int i=0; i<kPatternCount; i++)
            fprintf(stderr,"new scaleFactor[%d] = %.5f\n",i,scaleFactors[i]);
    }
}